

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::PortConnection::ConnMap::ConnMap
          (ConnMap *this,SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
          Scope *scope,LookupLocation lookupLocation)

{
  char *pcVar1;
  SyntaxKind SVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  NamedParamAssignmentSyntax *this_00;
  uint64_t hash;
  Diagnostic *pDVar9;
  SourceLocation SVar10;
  bool bVar11;
  ulong pos0;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  char cVar17;
  char cVar18;
  char cVar19;
  byte bVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  byte bVar32;
  LookupLocation lookupLocation_00;
  SourceRange SVar33;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar34;
  string_view name;
  PortConnectionSyntax *conn;
  const_iterator __begin2;
  try_emplace_args_t local_f9;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_f8;
  Scope *local_f0;
  string_view local_e8;
  uint32_t local_d4;
  NamedParamAssignmentSyntax *local_d0;
  iterator_base<const_slang::syntax::PortConnectionSyntax_*> local_c8;
  ulong local_b8;
  uint64_t local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  Scope *local_90;
  ulong local_88;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *local_80;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> local_78;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  Token local_48;
  
  local_90 = lookupLocation.scope;
  local_d4 = lookupLocation.index;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.data_ =
       (pointer)(this->orderedConns).
                super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.firstElement;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.len = 0;
  (this->orderedConns).super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.cap = 5;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap(&this->namedConns);
  (this->wildcardRange).startLoc = (SourceLocation)0x0;
  (this->wildcardRange).endLoc = (SourceLocation)0x0;
  (this->wildcardAttrs)._M_ptr = (pointer)0x0;
  (this->wildcardAttrs)._M_extent = 0;
  this->usingOrdered = true;
  this->hasWildcard = false;
  local_c8.index = 0;
  local_88 = (portConnections->elements)._M_extent._M_extent_value + 1 >> 1;
  local_f8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
             &(this->namedConns).super_Storage.field_0x108;
  bVar6 = false;
  local_f0 = scope;
  local_c8.list = portConnections;
  local_80 = portConnections;
  do {
    if ((local_c8.list == local_80) && (local_c8.index == local_88)) {
      return;
    }
    this_00 = (NamedParamAssignmentSyntax *)
              slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::
              iterator_base<const_slang::syntax::PortConnectionSyntax_*>::dereference(&local_c8);
    SVar2 = (this_00->super_ParamAssignmentSyntax).super_SyntaxNode.kind;
    bVar11 = SVar2 == EmptyPortConnection || SVar2 == OrderedPortConnection;
    local_d0 = this_00;
    if (bVar6) {
      if (this->usingOrdered != bVar11) {
        local_48 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_00);
        SVar10 = parsing::Token::location(&local_48);
        Scope::addDiag(scope,(DiagCode)0x800006,SVar10);
        return;
      }
    }
    else {
      this->usingOrdered = bVar11;
    }
    if (SVar2 == EmptyPortConnection) {
LAB_002cc7d5:
      SmallVectorBase<slang::syntax::PortConnectionSyntax_const*>::
      emplace_back<slang::syntax::PortConnectionSyntax_const*const&>
                ((SmallVectorBase<slang::syntax::PortConnectionSyntax_const*> *)this,
                 (PortConnectionSyntax **)&local_d0);
    }
    else if (SVar2 == WildcardPortConnection) {
      bVar6 = this->hasWildcard;
      this->hasWildcard = true;
      if (bVar6 == false) {
        SVar33 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        this->wildcardRange = SVar33;
        lookupLocation_00.index = local_d4;
        lookupLocation_00.scope = local_90;
        lookupLocation_00._12_4_ = 0;
        sVar34 = AttributeSymbol::fromSyntax
                           (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                              *)&(local_d0->openParen).info,scope,lookupLocation_00);
        this->wildcardAttrs = sVar34;
      }
      else {
        SVar33 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        pDVar9 = Scope::addDiag(scope,(DiagCode)0x340006,SVar33);
        Diagnostic::addNote(pDVar9,(DiagCode)0xc0001,this->wildcardRange);
      }
    }
    else {
      if (SVar2 == OrderedPortConnection) goto LAB_002cc7d5;
      local_e8 = parsing::Token::valueText((Token *)(this_00 + 1));
      if (local_e8._M_len != 0) {
        local_78.second = false;
        local_78.first = this_00;
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (local_f8,&local_e8);
        pos0 = hash >> ((this->namedConns).field_0x110 & 0x3f);
        lVar12 = (hash & 0xff) * 4;
        cVar17 = (&UNK_004a00ac)[lVar12];
        cVar18 = (&UNK_004a00ad)[lVar12];
        cVar19 = (&UNK_004a00ae)[lVar12];
        bVar20 = (&UNK_004a00af)[lVar12];
        uVar15 = (ulong)((uint)hash & 7);
        uVar14 = 0;
        uVar13 = pos0;
        cVar21 = cVar17;
        cVar22 = cVar18;
        cVar23 = cVar19;
        bVar24 = bVar20;
        cVar25 = cVar17;
        cVar26 = cVar18;
        cVar27 = cVar19;
        bVar28 = bVar20;
        cVar29 = cVar17;
        cVar30 = cVar18;
        cVar31 = cVar19;
        bVar32 = bVar20;
        do {
          lVar12 = *(long *)&(this->namedConns).field_0x120;
          pcVar1 = (char *)(lVar12 + uVar13 * 0x10);
          local_58 = *pcVar1;
          cStack_57 = pcVar1[1];
          cStack_56 = pcVar1[2];
          bStack_55 = pcVar1[3];
          cStack_54 = pcVar1[4];
          cStack_53 = pcVar1[5];
          cStack_52 = pcVar1[6];
          bStack_51 = pcVar1[7];
          cStack_50 = pcVar1[8];
          cStack_4f = pcVar1[9];
          cStack_4e = pcVar1[10];
          bStack_4d = pcVar1[0xb];
          cStack_4c = pcVar1[0xc];
          cStack_4b = pcVar1[0xd];
          cStack_4a = pcVar1[0xe];
          bVar7 = pcVar1[0xf];
          auVar16[0] = -(local_58 == cVar17);
          auVar16[1] = -(cStack_57 == cVar18);
          auVar16[2] = -(cStack_56 == cVar19);
          auVar16[3] = -(bStack_55 == bVar20);
          auVar16[4] = -(cStack_54 == cVar21);
          auVar16[5] = -(cStack_53 == cVar22);
          auVar16[6] = -(cStack_52 == cVar23);
          auVar16[7] = -(bStack_51 == bVar24);
          auVar16[8] = -(cStack_50 == cVar25);
          auVar16[9] = -(cStack_4f == cVar26);
          auVar16[10] = -(cStack_4e == cVar27);
          auVar16[0xb] = -(bStack_4d == bVar28);
          auVar16[0xc] = -(cStack_4c == cVar29);
          auVar16[0xd] = -(cStack_4b == cVar30);
          auVar16[0xe] = -(cStack_4a == cVar31);
          auVar16[0xf] = -(bVar7 == bVar32);
          uVar8 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
          bStack_49 = bVar7;
          if (uVar8 != 0) {
            lVar3 = *(long *)&(this->namedConns).field_0x128;
            local_b8 = pos0;
            local_b0 = hash;
            local_a8 = uVar14;
            local_a0 = uVar13;
            local_98 = uVar15;
            local_68 = cVar17;
            cStack_67 = cVar18;
            cStack_66 = cVar19;
            bStack_65 = bVar20;
            cStack_64 = cVar21;
            cStack_63 = cVar22;
            cStack_62 = cVar23;
            bStack_61 = bVar24;
            cStack_60 = cVar25;
            cStack_5f = cVar26;
            cStack_5e = cVar27;
            bStack_5d = bVar28;
            cStack_5c = cVar29;
            cStack_5b = cVar30;
            cStack_5a = cVar31;
            bStack_59 = bVar32;
            do {
              iVar5 = 0;
              if (uVar8 != 0) {
                for (; (uVar8 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
                }
              }
              __y = (basic_string_view<char,_std::char_traits<char>_> *)
                    ((ulong)(uint)(iVar5 << 5) + lVar3 + uVar13 * 0x1e0);
              bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )local_f8,&local_e8,__y);
              if (bVar6) {
                SVar10 = parsing::Token::location((Token *)(this_00 + 1));
                scope = local_f0;
                pDVar9 = Scope::addDiag(local_f0,(DiagCode)0x330006,SVar10);
                Diagnostic::operator<<(pDVar9,local_e8);
                SVar10 = parsing::Token::location((Token *)(__y[1]._M_len + 0x60));
                Diagnostic::addNote(pDVar9,(DiagCode)0xc0001,SVar10);
                goto LAB_002cc7e2;
              }
              uVar8 = uVar8 - 1 & uVar8;
            } while (uVar8 != 0);
            bVar7 = *(byte *)(lVar12 + uVar13 * 0x10 + 0xf);
            pos0 = local_b8;
            uVar13 = local_a0;
            uVar14 = local_a8;
            hash = local_b0;
            uVar15 = local_98;
            cVar17 = local_68;
            cVar18 = cStack_67;
            cVar19 = cStack_66;
            bVar20 = bStack_65;
            cVar21 = cStack_64;
            cVar22 = cStack_63;
            cVar23 = cStack_62;
            bVar24 = bStack_61;
            cVar25 = cStack_60;
            cVar26 = cStack_5f;
            cVar27 = cStack_5e;
            bVar28 = bStack_5d;
            cVar29 = cStack_5c;
            cVar30 = cStack_5b;
            cVar31 = cStack_5a;
            bVar32 = bStack_59;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar15] & bVar7) == 0) break;
          uVar4 = *(ulong *)&(this->namedConns).field_0x118;
          lVar12 = uVar13 + uVar14;
          uVar14 = uVar14 + 1;
          uVar13 = lVar12 + 1U & uVar4;
        } while (uVar14 <= uVar4);
        if (*(ulong *)&(this->namedConns).field_0x138 < *(ulong *)&(this->namedConns).field_0x130) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                    ((locator *)&local_48,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                      *)local_f8,pos0,hash,&local_f9,&local_e8,&local_78);
          scope = local_f0;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                    ((locator *)&local_48,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                      *)local_f8,hash,&local_f9,&local_e8,&local_78);
          scope = local_f0;
        }
      }
    }
LAB_002cc7e2:
    local_c8.index = local_c8.index + 1;
    bVar6 = true;
  } while( true );
}

Assistant:

PortConnection::ConnMap::ConnMap(
    const syntax::SeparatedSyntaxList<syntax::PortConnectionSyntax>& portConnections,
    const Scope& scope, LookupLocation lookupLocation) {

    bool hasConnections = false;
    for (auto conn : portConnections) {
        bool isOrdered = conn->kind == SyntaxKind::OrderedPortConnection ||
                         conn->kind == SyntaxKind::EmptyPortConnection;
        if (!hasConnections) {
            hasConnections = true;
            usingOrdered = isOrdered;
        }
        else if (isOrdered != usingOrdered) {
            scope.addDiag(diag::MixingOrderedAndNamedPorts, conn->getFirstToken().location());
            break;
        }

        if (isOrdered) {
            orderedConns.push_back(conn);
        }
        else if (conn->kind == SyntaxKind::WildcardPortConnection) {
            if (!std::exchange(hasWildcard, true)) {
                wildcardRange = conn->sourceRange();
                wildcardAttrs = AttributeSymbol::fromSyntax(conn->attributes, scope,
                                                            lookupLocation);
            }
            else {
                auto& diag = scope.addDiag(diag::DuplicateWildcardPortConnection,
                                           conn->sourceRange());
                diag.addNote(diag::NotePreviousUsage, wildcardRange);
            }
        }
        else {
            auto& npc = conn->as<NamedPortConnectionSyntax>();
            auto name = npc.name.valueText();
            if (!name.empty()) {
                auto pair = namedConns.emplace(name, std::make_pair(&npc, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicatePortConnection, npc.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }
}